

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_file_stat_internal
                  (mz_zip_archive *pZip,mz_uint file_index,mz_uint8 *pCentral_dir_header,
                  mz_zip_archive_file_stat *pStat,mz_bool *pFound_zip64_extra_data)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  mz_bool mVar4;
  uint uVar5;
  time_t tVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  mz_uint64 *pmVar11;
  short *psVar12;
  tm local_68;
  
  if (pFound_zip64_extra_data != (mz_bool *)0x0) {
    *pFound_zip64_extra_data = 0;
  }
  if (pCentral_dir_header == (mz_uint8 *)0x0 || pStat == (mz_zip_archive_file_stat *)0x0) {
    mVar4 = 0;
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
  }
  else {
    pStat->m_file_index = file_index;
    pStat->m_central_dir_ofs =
         (ulong)*(uint *)((long)(pZip->m_pState->m_central_dir_offsets).m_p + (ulong)file_index * 4)
    ;
    pStat->m_version_made_by = *(mz_uint16 *)(pCentral_dir_header + 4);
    pStat->m_version_needed = *(mz_uint16 *)(pCentral_dir_header + 6);
    pStat->m_bit_flag = *(mz_uint16 *)(pCentral_dir_header + 8);
    pStat->m_method = *(mz_uint16 *)(pCentral_dir_header + 10);
    bVar1 = (byte)*(ushort *)(pCentral_dir_header + 0xc);
    local_68.tm_gmtoff = 0;
    local_68.tm_wday = 0;
    local_68.tm_yday = 0;
    local_68.tm_zone = (char *)0x0;
    local_68.tm_isdst = -1;
    local_68._36_4_ = 0;
    local_68.tm_year = (pCentral_dir_header[0xf] >> 1) + 0x50;
    local_68.tm_mon = (*(ushort *)(pCentral_dir_header + 0xe) >> 5 & 0xf) - 1;
    local_68._8_8_ =
         (ulong)CONCAT14((char)*(ushort *)(pCentral_dir_header + 0xe),
                         (uint)(pCentral_dir_header[0xd] >> 3)) & 0x1fffffffff;
    local_68._0_8_ =
         (ulong)CONCAT24(*(ushort *)(pCentral_dir_header + 0xc) >> 5,(uint)bVar1 + (uint)bVar1) &
         0x3f0000003e;
    tVar6 = mktime(&local_68);
    pStat->m_time = tVar6;
    pStat->m_crc32 = *(mz_uint32 *)(pCentral_dir_header + 0x10);
    pStat->m_comp_size = (ulong)*(uint *)(pCentral_dir_header + 0x14);
    pStat->m_uncomp_size = (ulong)*(uint *)(pCentral_dir_header + 0x18);
    pStat->m_internal_attr = *(mz_uint16 *)(pCentral_dir_header + 0x24);
    pStat->m_external_attr = *(mz_uint32 *)(pCentral_dir_header + 0x26);
    pStat->m_local_header_ofs = (ulong)*(uint *)(pCentral_dir_header + 0x2a);
    uVar5 = (uint)*(ushort *)(pCentral_dir_header + 0x1c);
    if (0x1fe < *(ushort *)(pCentral_dir_header + 0x1c)) {
      uVar5 = 0x1ff;
    }
    memcpy(pStat->m_filename,pCentral_dir_header + 0x2e,(ulong)uVar5);
    pStat->m_filename[uVar5] = '\0';
    uVar5 = 0x1ff;
    if (*(ushort *)(pCentral_dir_header + 0x20) < 0x1ff) {
      uVar5 = (uint)*(ushort *)(pCentral_dir_header + 0x20);
    }
    pStat->m_comment_size = uVar5;
    memcpy(pStat->m_comment,
           pCentral_dir_header +
           (ulong)*(ushort *)(pCentral_dir_header + 0x1e) +
           (ulong)*(ushort *)(pCentral_dir_header + 0x1c) + 0x2e,(ulong)uVar5);
    pStat->m_comment[uVar5] = '\0';
    mVar4 = mz_zip_reader_is_file_a_directory(pZip,file_index);
    pStat->m_is_directory = mVar4;
    mVar4 = mz_zip_reader_is_file_encrypted(pZip,file_index);
    pStat->m_is_encrypted = mVar4;
    mVar4 = mz_zip_reader_is_file_supported(pZip,file_index);
    pStat->m_is_supported = mVar4;
    uVar7 = pStat->m_uncomp_size;
    if (pStat->m_uncomp_size < pStat->m_comp_size) {
      uVar7 = pStat->m_comp_size;
    }
    if (uVar7 <= pStat->m_local_header_ofs) {
      uVar7 = pStat->m_local_header_ofs;
    }
    mVar4 = 1;
    if (uVar7 == 0xffffffff) {
      uVar5 = (uint)*(ushort *)(pCentral_dir_header + 0x1e);
      if (*(ushort *)(pCentral_dir_header + 0x1e) != 0) {
        psVar12 = (short *)(pCentral_dir_header + 0x2e + *(ushort *)(pCentral_dir_header + 0x1c));
        do {
          if (uVar5 < 4) {
LAB_0010abdf:
            iVar8 = 1;
            if (pZip != (mz_zip_archive *)0x0) {
              pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            }
LAB_0010abf0:
            bVar3 = false;
          }
          else {
            uVar2 = psVar12[1];
            uVar10 = (uint)uVar2;
            if (uVar5 < uVar2 + 4) goto LAB_0010abdf;
            uVar9 = (uint)uVar2;
            if (*psVar12 == 1) {
              if (pFound_zip64_extra_data != (mz_bool *)0x0) {
                *pFound_zip64_extra_data = 1;
              }
              if (pStat->m_uncomp_size == 0xffffffff) {
                if (uVar9 < 8) goto LAB_0010abdf;
                pStat->m_uncomp_size = *(mz_uint64 *)(psVar12 + 2);
                pmVar11 = (mz_uint64 *)(psVar12 + 6);
                uVar10 = uVar9 - 8;
              }
              else {
                pmVar11 = (mz_uint64 *)(psVar12 + 2);
              }
              if (pStat->m_comp_size == 0xffffffff) {
                if (uVar10 < 8) goto LAB_0010abdf;
                pStat->m_comp_size = *pmVar11;
                pmVar11 = pmVar11 + 1;
                uVar10 = uVar10 - 8;
              }
              iVar8 = 2;
              if (pStat->m_local_header_ofs == 0xffffffff) {
                if (uVar10 < 8) goto LAB_0010abdf;
                pStat->m_local_header_ofs = *pmVar11;
              }
              goto LAB_0010abf0;
            }
            psVar12 = (short *)((long)psVar12 + (ulong)(uVar2 + 4));
            uVar5 = (uVar5 - uVar9) - 4;
            iVar8 = 0;
            bVar3 = true;
          }
          if (iVar8 != 0) {
            if ((iVar8 != 2) && (!bVar3)) {
              return 0;
            }
            break;
          }
        } while (uVar5 != 0);
      }
      mVar4 = 1;
    }
  }
  return mVar4;
}

Assistant:

static mz_bool mz_zip_file_stat_internal(mz_zip_archive *pZip,
                                         mz_uint file_index,
                                         const mz_uint8 *pCentral_dir_header,
                                         mz_zip_archive_file_stat *pStat,
                                         mz_bool *pFound_zip64_extra_data) {
  mz_uint n;
  const mz_uint8 *p = pCentral_dir_header;

  if (pFound_zip64_extra_data)
    *pFound_zip64_extra_data = MZ_FALSE;

  if ((!p) || (!pStat))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  /* Extract fields from the central directory record. */
  pStat->m_file_index = file_index;
  pStat->m_central_dir_ofs = MZ_ZIP_ARRAY_ELEMENT(
      &pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index);
  pStat->m_version_made_by = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS);
  pStat->m_version_needed = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_NEEDED_OFS);
  pStat->m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
  pStat->m_method = MZ_READ_LE16(p + MZ_ZIP_CDH_METHOD_OFS);
#ifndef MINIZ_NO_TIME
  pStat->m_time =
      mz_zip_dos_to_time_t(MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_TIME_OFS),
                           MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_DATE_OFS));
#endif
  pStat->m_crc32 = MZ_READ_LE32(p + MZ_ZIP_CDH_CRC32_OFS);
  pStat->m_comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
  pStat->m_uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
  pStat->m_internal_attr = MZ_READ_LE16(p + MZ_ZIP_CDH_INTERNAL_ATTR_OFS);
  pStat->m_external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
  pStat->m_local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);

  /* Copy as much of the filename and comment as possible. */
  n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - 1);
  memcpy(pStat->m_filename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
  pStat->m_filename[n] = '\0';

  n = MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS);
  n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILE_COMMENT_SIZE - 1);
  pStat->m_comment_size = n;
  memcpy(pStat->m_comment,
         p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
             MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
             MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS),
         n);
  pStat->m_comment[n] = '\0';

  /* Set some flags for convienance */
  pStat->m_is_directory = mz_zip_reader_is_file_a_directory(pZip, file_index);
  pStat->m_is_encrypted = mz_zip_reader_is_file_encrypted(pZip, file_index);
  pStat->m_is_supported = mz_zip_reader_is_file_supported(pZip, file_index);

  /* See if we need to read any zip64 extended information fields. */
  /* Confusingly, these zip64 fields can be present even on non-zip64 archives
   * (Debian zip on a huge files from stdin piped to stdout creates them). */
  if (MZ_MAX(MZ_MAX(pStat->m_comp_size, pStat->m_uncomp_size),
             pStat->m_local_header_ofs) == MZ_UINT32_MAX) {
    /* Attempt to find zip64 extended information field in the entry's extra
     * data */
    mz_uint32 extra_size_remaining = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

    if (extra_size_remaining) {
      const mz_uint8 *pExtra_data =
          p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
          MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);

      do {
        mz_uint32 field_id;
        mz_uint32 field_data_size;

        if (extra_size_remaining < (sizeof(mz_uint16) * 2))
          return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

        field_id = MZ_READ_LE16(pExtra_data);
        field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

        if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
          return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

        if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID) {
          const mz_uint8 *pField_data = pExtra_data + sizeof(mz_uint16) * 2;
          mz_uint32 field_data_remaining = field_data_size;

          if (pFound_zip64_extra_data)
            *pFound_zip64_extra_data = MZ_TRUE;

          if (pStat->m_uncomp_size == MZ_UINT32_MAX) {
            if (field_data_remaining < sizeof(mz_uint64))
              return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            pStat->m_uncomp_size = MZ_READ_LE64(pField_data);
            pField_data += sizeof(mz_uint64);
            field_data_remaining -= sizeof(mz_uint64);
          }

          if (pStat->m_comp_size == MZ_UINT32_MAX) {
            if (field_data_remaining < sizeof(mz_uint64))
              return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            pStat->m_comp_size = MZ_READ_LE64(pField_data);
            pField_data += sizeof(mz_uint64);
            field_data_remaining -= sizeof(mz_uint64);
          }

          if (pStat->m_local_header_ofs == MZ_UINT32_MAX) {
            if (field_data_remaining < sizeof(mz_uint64))
              return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            pStat->m_local_header_ofs = MZ_READ_LE64(pField_data);
            pField_data += sizeof(mz_uint64);
            field_data_remaining -= sizeof(mz_uint64);
          }

          break;
        }

        pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
        extra_size_remaining =
            extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
      } while (extra_size_remaining);
    }
  }

  return MZ_TRUE;
}